

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.cpp
# Opt level: O3

void __thiscall slang::ast::UnrollVisitor::handle(UnrollVisitor *this,ExpressionStatement *stmt)

{
  flat_hash_map<const_AssignmentExpression_*,_std::unique_ptr<SmallVector<PerAssignDriverState>_>_>
  *arrays_;
  size_t *psVar1;
  group_type_pointer pgVar2;
  default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_> *this_00
  ;
  undefined4 uVar3;
  AssignmentExpression *pAVar4;
  value_type_pointer ppVar5;
  ulong uVar6;
  undefined8 *puVar7;
  SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL> *__ptr;
  int iVar8;
  undefined1 auVar9 [16];
  undefined8 *puVar10;
  bool bVar11;
  pointer __p;
  ulong pos0;
  undefined8 *puVar12;
  long *plVar13;
  undefined8 uVar14;
  ulong uVar15;
  ulong hash;
  uint uVar16;
  pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*> *ppVar17;
  long lVar18;
  ulong uVar19;
  uchar uVar20;
  uchar uVar21;
  uchar uVar22;
  byte bVar23;
  undefined1 auVar24 [16];
  locator res;
  try_emplace_args_t local_89;
  AssignmentExpression *local_88;
  _Storage<std::pair<unsigned_long,_unsigned_long>,_true> local_80;
  long local_70;
  pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*> local_68 [2];
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  byte bStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  byte bStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  byte bStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  byte bStack_39;
  
  if ((this->anyErrors != false) ||
     (bVar11 = EvalContext::step(&this->evalCtx,(SourceLocation)0xffffffffffffffff), !bVar11)) {
    this->anyErrors = true;
  }
  pAVar4 = (AssignmentExpression *)stmt->expr;
  if ((pAVar4->super_Expression).kind == Assignment) {
    arrays_ = &this->driverMap;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = pAVar4;
    hash = SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),0);
    pos0 = hash >> ((byte)(this->driverMap).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState>_>_>,_slang::hash<const_slang::ast::AssignmentExpression_*>,_std::equal_to<const_slang::ast::AssignmentExpression_*>,_std::allocator<std::pair<const_slang::ast::AssignmentExpression_*const,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState>_>_>_>_>
                          .arrays.groups_size_index & 0x3f);
    uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[hash & 0xff];
    ppVar5 = (this->driverMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState>_>_>,_slang::hash<const_slang::ast::AssignmentExpression_*>,_std::equal_to<const_slang::ast::AssignmentExpression_*>,_std::allocator<std::pair<const_slang::ast::AssignmentExpression_*const,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState>_>_>_>_>
             .arrays.elements_;
    uVar6 = (this->driverMap).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState>_>_>,_slang::hash<const_slang::ast::AssignmentExpression_*>,_std::equal_to<const_slang::ast::AssignmentExpression_*>,_std::allocator<std::pair<const_slang::ast::AssignmentExpression_*const,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState>_>_>_>_>
            .arrays.groups_size_mask;
    uVar15 = 0;
    uVar19 = pos0;
    do {
      pgVar2 = (this->driverMap).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState>_>_>,_slang::hash<const_slang::ast::AssignmentExpression_*>,_std::equal_to<const_slang::ast::AssignmentExpression_*>,_std::allocator<std::pair<const_slang::ast::AssignmentExpression_*const,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState>_>_>_>_>
               .arrays.groups_ + uVar19;
      local_48 = pgVar2->m[0].n;
      uStack_47 = pgVar2->m[1].n;
      uStack_46 = pgVar2->m[2].n;
      bStack_45 = pgVar2->m[3].n;
      uStack_44 = pgVar2->m[4].n;
      uStack_43 = pgVar2->m[5].n;
      uStack_42 = pgVar2->m[6].n;
      bStack_41 = pgVar2->m[7].n;
      uStack_40 = pgVar2->m[8].n;
      uStack_3f = pgVar2->m[9].n;
      uStack_3e = pgVar2->m[10].n;
      bStack_3d = pgVar2->m[0xb].n;
      uStack_3c = pgVar2->m[0xc].n;
      uStack_3b = pgVar2->m[0xd].n;
      uStack_3a = pgVar2->m[0xe].n;
      bStack_39 = pgVar2->m[0xf].n;
      uVar20 = (uchar)uVar3;
      auVar24[0] = -(local_48 == uVar20);
      uVar21 = (uchar)((uint)uVar3 >> 8);
      auVar24[1] = -(uStack_47 == uVar21);
      uVar22 = (uchar)((uint)uVar3 >> 0x10);
      auVar24[2] = -(uStack_46 == uVar22);
      bVar23 = (byte)((uint)uVar3 >> 0x18);
      auVar24[3] = -(bStack_45 == bVar23);
      auVar24[4] = -(uStack_44 == uVar20);
      auVar24[5] = -(uStack_43 == uVar21);
      auVar24[6] = -(uStack_42 == uVar22);
      auVar24[7] = -(bStack_41 == bVar23);
      auVar24[8] = -(uStack_40 == uVar20);
      auVar24[9] = -(uStack_3f == uVar21);
      auVar24[10] = -(uStack_3e == uVar22);
      auVar24[0xb] = -(bStack_3d == bVar23);
      auVar24[0xc] = -(uStack_3c == uVar20);
      auVar24[0xd] = -(uStack_3b == uVar21);
      auVar24[0xe] = -(uStack_3a == uVar22);
      auVar24[0xf] = -(bStack_39 == bVar23);
      for (uVar16 = (uint)(ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe); local_88 = pAVar4
          , uVar16 != 0; uVar16 = uVar16 - 1 & uVar16) {
        iVar8 = 0;
        if (uVar16 != 0) {
          for (; (uVar16 >> iVar8 & 1) == 0; iVar8 = iVar8 + 1) {
          }
        }
        if (pAVar4 == *(AssignmentExpression **)
                       ((long)&ppVar5[uVar19 * 0xf].first + (ulong)(uint)(iVar8 << 4))) {
          lVar18 = (long)&ppVar5[uVar19 * 0xf].first + (ulong)(uint)(iVar8 << 4);
          goto LAB_008be597;
        }
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bStack_39) == 0) break;
      lVar18 = uVar19 + uVar15;
      uVar15 = uVar15 + 1;
      uVar19 = lVar18 + 1U & uVar6;
    } while (uVar15 <= uVar6);
    if ((this->driverMap).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState>_>_>,_slang::hash<const_slang::ast::AssignmentExpression_*>,_std::equal_to<const_slang::ast::AssignmentExpression_*>,_std::allocator<std::pair<const_slang::ast::AssignmentExpression_*const,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState>_>_>_>_>
        .size_ctrl.size <
        (this->driverMap).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState>_>_>,_slang::hash<const_slang::ast::AssignmentExpression_*>,_std::equal_to<const_slang::ast::AssignmentExpression_*>,_std::allocator<std::pair<const_slang::ast::AssignmentExpression_*const,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState>_>_>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::AssignmentExpression_const*,std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>,std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::AssignmentExpression_const*,void>,std::equal_to<slang::ast::AssignmentExpression_const*>,std::allocator<std::pair<slang::ast::AssignmentExpression_const*const,std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>,std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>>>>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::AssignmentExpression_const*>
                ((locator *)&local_80._M_value,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::AssignmentExpression_const*,std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>,std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::AssignmentExpression_const*,void>,std::equal_to<slang::ast::AssignmentExpression_const*>,std::allocator<std::pair<slang::ast::AssignmentExpression_const*const,std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>,std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>>>>>>
                  *)arrays_,(arrays_type *)arrays_,pos0,hash,&local_89,&local_88);
      psVar1 = &(this->driverMap).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState>_>_>,_slang::hash<const_slang::ast::AssignmentExpression_*>,_std::equal_to<const_slang::ast::AssignmentExpression_*>,_std::allocator<std::pair<const_slang::ast::AssignmentExpression_*const,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState>_>_>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
      lVar18 = local_70;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::AssignmentExpression_const*,std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>,std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::AssignmentExpression_const*,void>,std::equal_to<slang::ast::AssignmentExpression_const*>,std::allocator<std::pair<slang::ast::AssignmentExpression_const*const,std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>,std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>>>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::AssignmentExpression_const*>
                ((locator *)&local_80._M_value,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::AssignmentExpression_const*,std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>,std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::AssignmentExpression_const*,void>,std::equal_to<slang::ast::AssignmentExpression_const*>,std::allocator<std::pair<slang::ast::AssignmentExpression_const*const,std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>,std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>>>>>>
                  *)arrays_,hash,&local_89,&local_88);
      lVar18 = local_70;
    }
LAB_008be597:
    this_00 = (default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>
               *)(lVar18 + 8);
    if (*(long *)(lVar18 + 8) == 0) {
      plVar13 = (long *)operator_new(0x1d8);
      *plVar13 = (long)(plVar13 + 3);
      plVar13[1] = 0;
      plVar13[2] = 2;
      local_80._M_value.first = 0;
      __ptr = *(SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL> **)this_00;
      *(long **)this_00 = plVar13;
      if ((__ptr != (SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL> *)0x0) &&
         (std::
          default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>
          ::operator()(this_00,__ptr),
         (SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL> *)
         local_80._M_value.first !=
         (SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL> *)0x0)) {
        std::
        default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>::
        operator()((default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>
                    *)&local_80._M_value,
                   (SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL> *)
                   local_80._M_value.first);
      }
    }
    if (this->setupMode == true) {
      local_80._M_value.second = 0;
      local_70 = 2;
      local_80._M_value.first = (unsigned_long)local_68;
      Expression::getLongestStaticPrefixes
                (pAVar4->left_,
                 (SmallVector<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>,_2UL>
                  *)&local_80._M_value,&this->evalCtx,(Expression *)0x0);
      if (local_80._M_value.second != 0) {
        ppVar17 = (pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*> *)
                  (local_80._M_value.second * 0x10 + local_80._M_value.first);
        uVar14 = local_80._M_value.first;
        do {
          SmallVectorBase<slang::ast::UnrollVisitor::PerAssignDriverState>::
          emplace_back<slang::ast::Expression_const&,slang::ast::ValueSymbol_const&>
                    (*(SmallVectorBase<slang::ast::UnrollVisitor::PerAssignDriverState> **)this_00,
                     ((pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*> *)
                     uVar14)->second,
                     ((pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*> *)
                     uVar14)->first);
          uVar14 = uVar14 + 0x10;
        } while ((pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*> *)uVar14 !=
                 ppVar17);
      }
      if ((pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*> *)
          local_80._M_value.first != local_68) {
        operator_delete((void *)local_80._M_value.first);
      }
    }
    else {
      lVar18 = (*(long **)this_00)[1];
      if (lVar18 != 0) {
        puVar7 = (undefined8 *)**(long **)this_00;
        puVar10 = puVar7;
        do {
          ValueDriver::getBounds
                    ((optional<std::pair<unsigned_long,_unsigned_long>_> *)&local_80._M_value,
                     (Expression *)*puVar10,&this->evalCtx,(Type *)puVar10[2]);
          if ((char)local_70 == '\x01') {
            IntervalMap<unsigned_long,_std::monostate,_0U>::unionWith
                      ((IntervalMap<unsigned_long,_std::monostate,_0U> *)(puVar10 + 3),
                       local_80._M_value.first,local_80._M_value.second,(monostate *)&local_88,
                       &this->comp->unrollIntervalMapAllocator);
          }
          puVar12 = puVar10 + 0x1c;
          puVar10 = puVar10 + 0x1c;
        } while (puVar12 != puVar7 + lVar18 * 0x1c);
      }
    }
  }
  return;
}

Assistant:

void handle(const ExpressionStatement& stmt) {
        step();
        if (stmt.expr.kind != ExpressionKind::Assignment)
            return;

        auto& assign = stmt.expr.as<AssignmentExpression>();
        auto& driverState = driverMap[&assign];
        if (!driverState)
            driverState = std::make_unique<SmallVector<PerAssignDriverState>>();

        if (setupMode) {
            SmallVector<std::pair<const ValueSymbol*, const Expression*>> prefixes;
            assign.left().getLongestStaticPrefixes(prefixes, evalCtx);

            for (auto [symbol, expr] : prefixes)
                driverState->emplace_back(*expr, *symbol);
        }
        else {
            for (auto& state : *driverState) {
                auto bounds = ValueDriver::getBounds(*state.longestStaticPrefix, evalCtx,
                                                     *state.rootType);
                if (bounds) {
                    state.intervals.unionWith(*bounds, {}, comp.getUnrollIntervalMapAllocator());
                }
            }
        }
    }